

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

void __thiscall
flecs::query<Position,_Asteroid>::query(query<Position,_Asteroid> *this,world *world)

{
  bool bVar1;
  world_t *pwVar2;
  char *expr;
  ecs_query_t *peVar3;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream str;
  world *world_local;
  query<Position,_Asteroid> *this_local;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pwVar2 = flecs::world::c_ptr(world);
  bVar1 = _::pack_args_to_string<Position,Asteroid>(pwVar2,(stringstream *)local_1a0,true);
  if (!bVar1) {
    _ecs_abort(2,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
               ,0x10c9);
    abort();
  }
  pwVar2 = flecs::world::c_ptr(world);
  (this->super_query_base).m_world = pwVar2;
  pwVar2 = flecs::world::c_ptr(world);
  std::__cxx11::stringstream::str();
  expr = (char *)std::__cxx11::string::c_str();
  peVar3 = ecs_query_new(pwVar2,expr);
  (this->super_query_base).m_query = peVar3;
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

explicit query(const world& world) {
        std::stringstream str;
        if (!_::pack_args_to_string<Components...>(world.c_ptr(), str, true)) {
            ecs_abort(ECS_INVALID_PARAMETER, NULL);
        }

        m_world = world.c_ptr();
        m_query = ecs_query_new(world.c_ptr(), str.str().c_str());
    }